

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O2

int dsa_missing_parameters(EVP_PKEY *pkey)

{
  DSA *dsa;
  BIGNUM *pBVar1;
  uint uVar2;
  
  dsa = (DSA *)pkey->pkey;
  pBVar1 = DSA_get0_p(dsa);
  uVar2 = 1;
  if (pBVar1 != (BIGNUM *)0x0) {
    pBVar1 = DSA_get0_q(dsa);
    if (pBVar1 != (BIGNUM *)0x0) {
      pBVar1 = DSA_get0_g(dsa);
      uVar2 = (uint)(pBVar1 == (BIGNUM *)0x0);
    }
  }
  return uVar2;
}

Assistant:

static int dsa_missing_parameters(const EVP_PKEY *pkey) {
  const DSA *dsa = reinterpret_cast<const DSA *>(pkey->pkey);
  if (DSA_get0_p(dsa) == nullptr || DSA_get0_q(dsa) == nullptr ||
      DSA_get0_g(dsa) == nullptr) {
    return 1;
  }
  return 0;
}